

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O0

size_t RVO::linearProgram3(vector<RVO::Plane,_std::allocator<RVO::Plane>_> *planes,float radius,
                          Vector3 *optVelocity,bool directionOpt,Vector3 *result)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference vector;
  float fVar4;
  float fVar5;
  undefined1 local_80 [8];
  Vector3 tempResult;
  ulong local_68;
  size_t i;
  Vector3 local_50;
  Vector3 local_44;
  Vector3 *local_38;
  Vector3 *result_local;
  Vector3 *pVStack_28;
  bool directionOpt_local;
  Vector3 *optVelocity_local;
  vector<RVO::Plane,_std::allocator<RVO::Plane>_> *pvStack_18;
  float radius_local;
  vector<RVO::Plane,_std::allocator<RVO::Plane>_> *planes_local;
  
  local_38 = result;
  result_local._7_1_ = directionOpt;
  pVStack_28 = optVelocity;
  optVelocity_local._4_4_ = radius;
  pvStack_18 = planes;
  if (directionOpt) {
    Vector3::operator*(&local_44,radius);
    *(undefined8 *)local_38->val_ = local_44.val_._0_8_;
    local_38->val_[2] = local_44.val_[2];
  }
  else {
    fVar5 = absSq(optVelocity);
    fVar4 = sqr(optVelocity_local._4_4_);
    if (fVar5 <= fVar4) {
      *(undefined8 *)local_38->val_ = *(undefined8 *)pVStack_28->val_;
      local_38->val_[2] = pVStack_28->val_[2];
    }
    else {
      normalize((RVO *)((long)&i + 4),pVStack_28);
      Vector3::operator*(&local_50,optVelocity_local._4_4_);
      *(undefined8 *)local_38->val_ = local_50.val_._0_8_;
      local_38->val_[2] = local_50.val_[2];
    }
  }
  local_68 = 0;
  do {
    sVar2 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::size(pvStack_18);
    if (sVar2 <= local_68) {
      sVar2 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::size(pvStack_18);
      return sVar2;
    }
    pvVar3 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](pvStack_18,local_68);
    vector = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](pvStack_18,local_68);
    Vector3::operator-((Vector3 *)(tempResult.val_ + 1),&vector->point);
    fVar5 = Vector3::operator*(&pvVar3->normal,(Vector3 *)(tempResult.val_ + 1));
    if (0.0 < fVar5) {
      Vector3::Vector3((Vector3 *)local_80,local_38);
      bVar1 = linearProgram2(pvStack_18,local_68,optVelocity_local._4_4_,pVStack_28,
                             (bool)(result_local._7_1_ & 1),local_38);
      if (!bVar1) {
        *(undefined1 (*) [8])local_38->val_ = local_80;
        local_38->val_[2] = tempResult.val_[0];
        return local_68;
      }
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

size_t linearProgram3(const std::vector<Plane> &planes, float radius, const Vector3 &optVelocity, bool directionOpt, Vector3 &result)
	{
		if (directionOpt) {
			/* Optimize direction. Note that the optimization velocity is of unit length in this case. */
			result = optVelocity * radius;
		}
		else if (absSq(optVelocity) > sqr(radius)) {
			/* Optimize closest point and outside circle. */
			result = normalize(optVelocity) * radius;
		}
		else {
			/* Optimize closest point and inside circle. */
			result = optVelocity;
		}

		for (size_t i = 0; i < planes.size(); ++i) {
			if (planes[i].normal * (planes[i].point - result) > 0.0f) {
				/* Result does not satisfy constraint i. Compute new optimal result. */
				const Vector3 tempResult = result;

				if (!linearProgram2(planes, i, radius, optVelocity, directionOpt, result)) {
					result = tempResult;
					return i;
				}
			}
		}

		return planes.size();
	}